

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O1

void SharpYuvInit(VP8CPUInfo cpu_info_func)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&SharpYuvInit::sharpyuv_lock);
  if (iVar1 != 0) {
    return;
  }
  if ((VP8CPUInfo *)cpu_info_func != &SharpYuvGetCPUInfo) {
    SharpYuvGetCPUInfo = cpu_info_func;
  }
  if (SharpYuvInit::sharpyuv_last_cpuinfo_used != SharpYuvGetCPUInfo) {
    SharpYuvInitDsp();
    SharpYuvInitGammaTables();
    SharpYuvInit::sharpyuv_last_cpuinfo_used = SharpYuvGetCPUInfo;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&SharpYuvInit::sharpyuv_lock);
  return;
}

Assistant:

void SharpYuvInit(VP8CPUInfo cpu_info_func) {
  static volatile VP8CPUInfo sharpyuv_last_cpuinfo_used =
      (VP8CPUInfo)&sharpyuv_last_cpuinfo_used;
  LOCK_ACCESS;
  // Only update SharpYuvGetCPUInfo when called from external code to avoid a
  // race on reading the value in SharpYuvConvert().
  if (cpu_info_func != (VP8CPUInfo)&SharpYuvGetCPUInfo) {
    SharpYuvGetCPUInfo = cpu_info_func;
  }
  if (sharpyuv_last_cpuinfo_used == SharpYuvGetCPUInfo) {
    UNLOCK_ACCESS_AND_RETURN;
  }

  SharpYuvInitDsp();
  SharpYuvInitGammaTables();

  sharpyuv_last_cpuinfo_used = SharpYuvGetCPUInfo;
  UNLOCK_ACCESS_AND_RETURN;
}